

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * __thiscall mkvparser::Segment::FindCluster(Segment *this,longlong time_ns)

{
  longlong lVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  Cluster *pCluster;
  long k;
  longlong t;
  Cluster *pCluster_2;
  long k_1;
  long j;
  long i;
  Cluster *pCluster_1;
  Cluster *in_stack_ffffffffffffffb8;
  long local_30;
  long local_28;
  Cluster *local_8;
  
  if ((*(long *)(in_RDI + 0xa8) == 0) || (*(long *)(in_RDI + 0xb0) < 1)) {
    local_8 = (Cluster *)(in_RDI + 0x20);
  }
  else {
    local_8 = (Cluster *)**(long **)(in_RDI + 0xa8);
    lVar1 = Cluster::GetTime(in_stack_ffffffffffffffb8);
    if (lVar1 < in_RSI) {
      local_28 = 0;
      lVar2 = *(long *)(in_RDI + 0xb0);
      while (local_30 = lVar2, local_28 < local_30) {
        lVar2 = local_28 + (local_30 - local_28) / 2;
        in_stack_ffffffffffffffb8 = (Cluster *)Cluster::GetTime(in_stack_ffffffffffffffb8);
        if ((long)in_stack_ffffffffffffffb8 <= in_RSI) {
          local_28 = lVar2 + 1;
          lVar2 = local_30;
        }
      }
      local_8 = *(Cluster **)(*(long *)(in_RDI + 0xa8) + (local_28 + -1) * 8);
    }
  }
  return local_8;
}

Assistant:

const Cluster* Segment::FindCluster(long long time_ns) const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  {
    Cluster* const pCluster = m_clusters[0];
    assert(pCluster);
    assert(pCluster->m_index == 0);

    if (time_ns <= pCluster->GetTime())
      return pCluster;
  }

  // Binary search of cluster array

  long i = 0;
  long j = m_clusterCount;

  while (i < j) {
    // INVARIANT:
    //[0, i) <= time_ns
    //[i, j) ?
    //[j, m_clusterCount)  > time_ns

    const long k = i + (j - i) / 2;
    assert(k < m_clusterCount);

    Cluster* const pCluster = m_clusters[k];
    assert(pCluster);
    assert(pCluster->m_index == k);

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    assert(i <= j);
  }

  assert(i == j);
  assert(i > 0);
  assert(i <= m_clusterCount);

  const long k = i - 1;

  Cluster* const pCluster = m_clusters[k];
  assert(pCluster);
  assert(pCluster->m_index == k);
  assert(pCluster->GetTime() <= time_ns);

  return pCluster;
}